

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseStructLine(CStructure *st)

{
  int iVar1;
  CStructure *st_local;
  
  CompiledCurrentLine = CompiledCurrentLine + 1;
  lp = ReplaceDefine(line);
  if (*lp != '\0') {
    ParseStructLabel(st);
    iVar1 = SkipBlanks();
    if (iVar1 == 0) {
      ParseStructMember(st);
      iVar1 = SkipBlanks();
      if ((iVar1 == 0) && (*lp != '\0')) {
        Error("[STRUCT] Unexpected",lp,PASS3);
      }
    }
  }
  return;
}

Assistant:

void ParseStructLine(CStructure* st) {
	++CompiledCurrentLine;
	lp = ReplaceDefine(line);
	if (!*lp) return;
	ParseStructLabel(st);
	if (SkipBlanks()) return;
	ParseStructMember(st);
	if (SkipBlanks()) return;
	if (*lp) Error("[STRUCT] Unexpected", lp);
}